

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

string * __thiscall
glu::sl::ShaderParser::parseStringLiteral_abi_cxx11_
          (string *__return_storage_ptr__,ShaderParser *this,char *str)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  ostringstream o;
  char local_1a1;
  undefined1 local_1a0 [376];
  
  cVar1 = *str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  cVar2 = str[1];
  if (cVar2 != '\0' && cVar2 != cVar1) {
    pcVar3 = str + 1;
    do {
      if (cVar2 == '\\') {
        cVar2 = pcVar3[1];
        if (cVar2 != '\0') {
          if (cVar2 == 't') {
            local_1a1 = '\t';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1a1,1);
          }
          else if (cVar2 == 'n') {
            local_1a1 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1a1,1);
          }
          else {
            local_1a1 = cVar2;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1a1,1);
          }
        }
        pcVar3 = pcVar3 + 2;
      }
      else {
        local_1a1 = cVar2;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,&local_1a1,1);
        pcVar3 = pcVar3 + 1;
      }
      cVar2 = *pcVar3;
    } while ((cVar2 != cVar1) && (cVar2 != '\0'));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string ShaderParser::parseStringLiteral (const char* str)
{
	const char*		p		= str;
	char			endChar = *p++;
	ostringstream	o;

	while (*p != endChar && *p)
	{
		if (*p == '\\')
		{
			switch (p[1])
			{
				case 0:		DE_ASSERT(DE_FALSE);	break;
				case 'n':	o << '\n';				break;
				case 't':	o << '\t';				break;
				default:	o << p[1];				break;
			}

			p += 2;
		}
		else
			o << *p++;
	}

	return o.str();
}